

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator f;
  iterator l;
  bool bVar1;
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  long in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i_1;
  size_type old_count;
  int i;
  key_type *in_stack_fffffffffffffcc8;
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffcd0;
  AssertHelper *this_01;
  uint *in_stack_fffffffffffffcd8;
  unsigned_long *lhs;
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffce0;
  char *rhs_expression;
  char *in_stack_fffffffffffffce8;
  char *lhs_expression;
  int line;
  char *in_stack_fffffffffffffcf0;
  char *file;
  undefined8 in_stack_fffffffffffffcf8;
  Type type;
  AssertHelper *in_stack_fffffffffffffd00;
  AssertHelper *this_02;
  Message *in_stack_fffffffffffffd48;
  AssertHelper *in_stack_fffffffffffffd50;
  AssertionResult local_240 [2];
  size_type local_220;
  undefined4 local_214;
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffe00;
  value_type *in_stack_fffffffffffffe08;
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe18 [48];
  undefined1 auVar2 [32];
  undefined8 in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  Message *in_stack_fffffffffffffe88;
  AssertHelper *local_170;
  undefined1 local_168 [80];
  undefined1 local_118 [8];
  AssertHelper *pAStack_110;
  unsigned_long *local_108;
  char *pcStack_100;
  char *local_f8;
  char *pcStack_f0;
  undefined8 local_e8;
  Type TStack_e4;
  AssertHelper *pAStack_e0;
  key_type local_b0;
  size_type local_a8;
  undefined4 local_9c;
  AssertionResult local_98;
  int local_84;
  size_type local_80;
  value_type local_20;
  int local_14;
  key_type local_10;
  
  local_10 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  for (local_14 = 10; local_14 < 2000; local_14 = local_14 + 1) {
    local_20 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(in_stack_fffffffffffffcd0,
                              (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  local_80 = google::
             BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xec8479);
  for (local_84 = 10; local_84 < 1000; local_84 = local_84 + 1) {
    local_9c = 1;
    local_b0 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20)
                          );
    local_a8 = google::
               BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::erase((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8
               ,(unsigned_long *)in_stack_fffffffffffffcd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd00);
      testing::AssertionResult::failure_message((AssertionResult *)0xec854f);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd00,(Type)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                 in_stack_fffffffffffffcf0,(int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                 (char *)in_stack_fffffffffffffce0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
      testing::Message::~Message((Message *)0xec85b2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xec861d);
  }
  this_00 = (BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(this_00);
  memcpy(local_118,local_168,0x48);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(this_00);
  memcpy(&stack0xfffffffffffffe50,&stack0xfffffffffffffe00,0x48);
  f.pos.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe08;
  f.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          *)in_stack_fffffffffffffe00;
  f.pos.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe10;
  auVar2 = in_stack_fffffffffffffe18._16_32_;
  f.pos.row_current._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe18._0_8_;
  f.pos.col_current = (const_nonempty_iterator)in_stack_fffffffffffffe18._8_8_;
  f.end.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)auVar2._0_8_;
  f.end.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)auVar2._8_8_;
  f.end.row_current._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)auVar2._16_8_;
  f.end.col_current = (const_nonempty_iterator)auVar2._24_8_;
  l.pos.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe50;
  l.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          *)in_stack_fffffffffffffe48;
  l.pos.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe58;
  l.pos.row_current._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe60;
  l.pos.col_current = (const_nonempty_iterator)in_stack_fffffffffffffe68;
  l.end.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe70;
  l.end.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe78;
  l.end.row_current._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe80;
  l.end.col_current = (const_nonempty_iterator)in_stack_fffffffffffffe88;
  type = TStack_e4;
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffdf0,f,l);
  local_214 = 0;
  local_220 = google::
              BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xec8768);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (local_f8,pcStack_100,(uint *)local_108,(unsigned_long *)pAStack_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffdf0);
  this_01 = pAStack_110;
  lhs = local_108;
  rhs_expression = pcStack_100;
  lhs_expression = local_f8;
  file = pcStack_f0;
  this_02 = pAStack_e0;
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_e0);
    testing::AssertionResult::failure_message((AssertionResult *)0xec87cf);
    testing::internal::AssertHelper::AssertHelper
              (pAStack_e0,type,pcStack_f0,(int)((ulong)local_f8 >> 0x20),pcStack_100);
    testing::internal::AssertHelper::operator=(local_170,in_stack_fffffffffffffe88);
    testing::internal::AssertHelper::~AssertHelper(pAStack_110);
    testing::Message::~Message((Message *)0xec8832);
    this_01 = pAStack_110;
    lhs = local_108;
    rhs_expression = pcStack_100;
    lhs_expression = local_f8;
    file = pcStack_f0;
    this_02 = pAStack_e0;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xec88a0);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  *)0xec88b1);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (lhs_expression,rhs_expression,lhs,(unsigned_long *)this_01);
  line = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_240);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xec892a);
    testing::internal::AssertHelper::AssertHelper(this_02,type,file,line,rhs_expression);
    testing::internal::AssertHelper::operator=(local_170,in_stack_fffffffffffffe88);
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0xec898d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xec89f8);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, EraseDoesNotResize) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  for (int i = 10; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  const typename TypeParam::size_type old_count = this->ht_.bucket_count();
  for (int i = 10; i < 1000; i++) {  // erase half one at a time
    EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(i)));
  }
  this->ht_.erase(this->ht_.begin(), this->ht_.end());  // and the rest at once
  EXPECT_EQ(0u, this->ht_.size());
  EXPECT_EQ(old_count, this->ht_.bucket_count());
}